

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckAlign
          (SharedValidator *this,Location *loc,Address alignment,Address natural_alignment)

{
  uint uVar1;
  char *format;
  
  uVar1 = (uint)alignment - 1;
  if (uVar1 < ((uint)alignment ^ uVar1)) {
    if (alignment <= natural_alignment) {
      return (Result)Ok;
    }
    format = "alignment must not be larger than natural alignment (%lu)";
  }
  else {
    format = "alignment (%lu) must be a power of 2";
    natural_alignment = alignment;
  }
  PrintError(this,loc,format,natural_alignment);
  return (Result)Error;
}

Assistant:

Result SharedValidator::CheckAlign(const Location& loc,
                                   Address alignment,
                                   Address natural_alignment) {
  if (!is_power_of_two(alignment)) {
    PrintError(loc, "alignment (%" PRIaddress ") must be a power of 2",
               alignment);
    return Result::Error;
  }
  if (alignment > natural_alignment) {
    PrintError(
        loc,
        "alignment must not be larger than natural alignment (%" PRIaddress ")",
        natural_alignment);
    return Result::Error;
  }
  return Result::Ok;
}